

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FundamentalOperationalData.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::FundamentalOperationalData::operator==
          (FundamentalOperationalData *this,FundamentalOperationalData *Value)

{
  FundamentalOperationalData *Value_local;
  FundamentalOperationalData *this_local;
  
  if ((this->field_0).field_0.m_ui8SystemStatus == (Value->field_0).field_0.m_ui8SystemStatus) {
    if ((this->field_0).field_0.m_ui8AltParam4 == (Value->field_0).field_0.m_ui8AltParam4) {
      if ((this->field_0).field_0.m_ui8InfoLayers == (Value->field_0).field_0.m_ui8InfoLayers) {
        if ((this->field_0).field_0.m_ui8Modifier == (Value->field_0).field_0.m_ui8Modifier) {
          if ((this->field_0).field_0.m_ui16Param1 == (Value->field_0).field_0.m_ui16Param1) {
            if ((this->field_0).field_0.m_ui16Param2 == (Value->field_0).field_0.m_ui16Param2) {
              if ((this->field_0).field_0.m_ui16Param3 == (Value->field_0).field_0.m_ui16Param3) {
                if ((this->field_0).field_0.m_ui16Param4 == (Value->field_0).field_0.m_ui16Param4) {
                  if ((this->field_0).field_0.m_ui16Param5 == (Value->field_0).field_0.m_ui16Param5)
                  {
                    if ((this->field_0).field_0.m_ui16Param6 ==
                        (Value->field_0).field_0.m_ui16Param6) {
                      this_local._7_1_ = true;
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL FundamentalOperationalData::operator == ( const FundamentalOperationalData & Value ) const
{
    if( m_ui8SystemStatus   != Value.m_ui8SystemStatus )    return false;
    if( m_ui8AltParam4      != Value.m_ui8AltParam4 )       return false;
    if( m_ui8InfoLayers     != Value.m_ui8InfoLayers )      return false;
    if( m_ui8Modifier       != Value.m_ui8Modifier )        return false;
    if( m_ui16Param1        != Value.m_ui16Param1 )         return false;
    if( m_ui16Param2        != Value.m_ui16Param2 )         return false;
    if( m_ui16Param3        != Value.m_ui16Param3 )         return false;
    if( m_ui16Param4        != Value.m_ui16Param4 )         return false;
    if( m_ui16Param5        != Value.m_ui16Param5 )         return false;
    if( m_ui16Param6        != Value.m_ui16Param6 )         return false;
    return true;
}